

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::RGBIlluminantSpectrum::Sample(RGBIlluminantSpectrum *this,SampledWavelengths *lambda)

{
  Float FVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [56];
  undefined1 auVar14 [16];
  undefined1 auVar16 [56];
  undefined1 auVar17 [16];
  SampledSpectrum SVar18;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  undefined1 auVar12 [64];
  undefined1 auVar15 [64];
  
  FVar1 = (this->rsp).c0;
  auVar11._4_4_ = FVar1;
  auVar11._0_4_ = FVar1;
  auVar11._8_4_ = FVar1;
  auVar11._12_4_ = FVar1;
  auVar9 = *(undefined1 (*) [16])(lambda->lambda).values;
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = 0x3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  FVar1 = (this->rsp).c1;
  auVar7._4_4_ = FVar1;
  auVar7._0_4_ = FVar1;
  auVar7._8_4_ = FVar1;
  auVar7._12_4_ = FVar1;
  auVar7 = vfmadd213ps_avx512vl(auVar11,auVar9,auVar7);
  FVar1 = (this->rsp).c2;
  auVar8._4_4_ = FVar1;
  auVar8._0_4_ = FVar1;
  auVar8._8_4_ = FVar1;
  auVar8._12_4_ = FVar1;
  auVar8 = vfmadd213ps_avx512vl(auVar7,auVar9,auVar8);
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx512vl(auVar8,auVar9);
  auVar3._8_4_ = 0x7f800000;
  auVar3._0_8_ = 0x7f8000007f800000;
  auVar3._12_4_ = 0x7f800000;
  uVar6 = vpcmpd_avx512vl(auVar9,auVar3,4);
  uVar6 = uVar6 & 0xf;
  auVar9 = vfmadd213ps_fma(auVar8,auVar8,auVar17);
  auVar9 = vsqrtps_avx(auVar9);
  auVar14._0_4_ = auVar9._0_4_ + auVar9._0_4_;
  auVar14._4_4_ = auVar9._4_4_ + auVar9._4_4_;
  auVar14._8_4_ = auVar9._8_4_ + auVar9._8_4_;
  auVar14._12_4_ = auVar9._12_4_ + auVar9._12_4_;
  auVar7 = vdivps_avx(auVar8,auVar14);
  auVar16 = ZEXT856(auVar7._8_8_);
  auVar9 = vcmpps_avx(ZEXT816(0) << 0x40,auVar8,1);
  auVar9 = vandps_avx(auVar9,auVar17);
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  auVar7 = vaddps_avx512vl(auVar7,auVar4);
  bVar2 = (bool)((byte)uVar6 & 1);
  auVar10._0_4_ = (uint)bVar2 * auVar7._0_4_ | (uint)!bVar2 * auVar9._0_4_;
  bVar2 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar10._4_4_ = (uint)bVar2 * auVar7._4_4_ | (uint)!bVar2 * auVar9._4_4_;
  bVar2 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar10._8_4_ = (uint)bVar2 * auVar7._8_4_ | (uint)!bVar2 * auVar9._8_4_;
  bVar2 = SUB81(uVar6 >> 3,0);
  auVar10._12_4_ = (uint)bVar2 * auVar7._12_4_ | (uint)!bVar2 * auVar9._12_4_;
  FVar1 = this->scale;
  auVar5._4_4_ = FVar1;
  auVar5._0_4_ = FVar1;
  auVar5._8_4_ = FVar1;
  auVar5._12_4_ = FVar1;
  auVar7 = vmulps_avx512vl(auVar10,auVar5);
  auVar13 = ZEXT856(auVar7._8_8_);
  SVar18 = DenselySampledSpectrum::Sample(this->illuminant,lambda);
  auVar15._0_8_ = SVar18.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar12._0_8_ = SVar18.values.values._0_8_;
  auVar12._8_56_ = auVar13;
  auVar9 = vmovlhps_avx(auVar12._0_16_,auVar15._0_16_);
  local_18 = auVar7._0_4_;
  fStack_14 = auVar7._4_4_;
  fStack_10 = auVar7._8_4_;
  fStack_c = auVar7._12_4_;
  local_18 = auVar9._0_4_ * local_18;
  fStack_14 = auVar9._4_4_ * fStack_14;
  auVar9 = CONCAT412(auVar9._12_4_ * fStack_c,
                     CONCAT48(auVar9._8_4_ * fStack_10,CONCAT44(fStack_14,local_18)));
  auVar9 = vshufpd_avx(auVar9,auVar9,1);
  SVar18.values.values._8_8_ = auVar9._0_8_;
  SVar18.values.values[0] = local_18;
  SVar18.values.values[1] = fStack_14;
  return (SampledSpectrum)SVar18.values.values;
}

Assistant:

Sample(const SampledWavelengths &lambda) const {
        SampledSpectrum s;
        for (int i = 0; i < NSpectrumSamples; ++i)
            s[i] = scale * rsp(lambda[i]);
        return s * illuminant->Sample(lambda);
    }